

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

ParameterError
file2memory_range(char **bufp,size_t *size,FILE *file,curl_off_t starto,curl_off_t endo)

{
  undefined1 *puVar1;
  int iVar2;
  CURLcode CVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  curl_off_t cVar7;
  undefined1 local_1078 [8];
  char **local_1070;
  size_t *local_1068;
  long local_1060;
  dynbuf dyn;
  char buffer [4096];
  
  if (file == (FILE *)0x0) {
    *size = 0;
    *bufp = (char *)0x0;
    return PARAM_OK;
  }
  local_1068 = size;
  if (starto == 0) {
    starto = 0;
  }
  else {
    if (_stdin == file) {
      cVar7 = 0;
      goto LAB_0011a078;
    }
    iVar2 = fseeko64((FILE *)file,starto,0);
    if (iVar2 != 0) {
      return PARAM_READ_ERROR;
    }
  }
  cVar7 = starto;
  starto = 0;
LAB_0011a078:
  local_1070 = bufp;
  curlx_dyn_init(&dyn,0x400000000);
  local_1060 = endo + 1;
  do {
    sVar4 = fread(buffer,1,0x1000,(FILE *)file);
    iVar2 = ferror((FILE *)file);
    if (iVar2 != 0) {
      curlx_dyn_free(&dyn);
      *local_1068 = 0;
      *local_1070 = (char *)0x0;
      return PARAM_READ_ERROR;
    }
    if (sVar4 != 0) {
      puVar1 = local_1078;
      if (starto == 0) {
LAB_0011a0eb:
        sVar5 = local_1060 - cVar7;
        if ((long)(cVar7 + sVar4) <= endo) {
          sVar5 = sVar4;
        }
        CVar3 = curlx_dyn_addn(&dyn,puVar1 + 0x40,sVar5);
        if (CVar3 != CURLE_OK) {
          return PARAM_NO_MEM;
        }
        cVar7 = cVar7 + sVar5;
        if (endo < cVar7) break;
      }
      else {
        if ((long)sVar4 <= starto) {
          cVar7 = cVar7 + sVar4;
          starto = starto - sVar4;
          goto LAB_0011a11f;
        }
        cVar7 = cVar7 + starto;
        sVar4 = sVar4 - starto;
        if (sVar4 != 0) {
          puVar1 = local_1078 + starto;
          goto LAB_0011a0eb;
        }
      }
      starto = 0;
    }
LAB_0011a11f:
    iVar2 = feof((FILE *)file);
  } while (iVar2 == 0);
  sVar5 = curlx_dyn_len(&dyn);
  *local_1068 = sVar5;
  pcVar6 = curlx_dyn_ptr(&dyn);
  *local_1070 = pcVar6;
  return PARAM_OK;
}

Assistant:

ParameterError file2memory_range(char **bufp, size_t *size, FILE *file,
                                 curl_off_t starto, curl_off_t endo)
{
  if(file) {
    size_t nread;
    struct curlx_dynbuf dyn;
    curl_off_t offset = 0;
    curl_off_t throwaway = 0;

    if(starto) {
      if(file != stdin) {
        if(myfseek(file, starto, SEEK_SET))
          return PARAM_READ_ERROR;
        offset = starto;
      }
      else
        /* we can't seek stdin, read 'starto' bytes and throw them away */
        throwaway = starto;
    }

    /* The size needs to fit in an int later */
    curlx_dyn_init(&dyn, MAX_FILE2MEMORY);
    do {
      char buffer[4096];
      size_t n_add;
      char *ptr_add;
      nread = fread(buffer, 1, sizeof(buffer), file);
      if(ferror(file)) {
        curlx_dyn_free(&dyn);
        *size = 0;
        *bufp = NULL;
        return PARAM_READ_ERROR;
      }
      n_add = nread;
      ptr_add = buffer;
      if(nread) {
        if(throwaway) {
          if(throwaway >= (curl_off_t)nread) {
            throwaway -= nread;
            offset += nread;
            n_add = 0; /* nothing to add */
          }
          else {
            /* append the trailing piece */
            n_add = (size_t)(nread - throwaway);
            ptr_add = &buffer[throwaway];
            offset += throwaway;
            throwaway = 0;
          }
        }
        if(n_add) {
          if((curl_off_t)(n_add + offset) > endo)
            n_add = (size_t)(endo - offset + 1);

          if(curlx_dyn_addn(&dyn, ptr_add, n_add))
            return PARAM_NO_MEM;

          offset += n_add;
          if(offset > endo)
            break;
        }
      }
    } while(!feof(file));
    *size = curlx_dyn_len(&dyn);
    *bufp = curlx_dyn_ptr(&dyn);
  }
  else {
    *size = 0;
    *bufp = NULL;
  }
  return PARAM_OK;
}